

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTreeWidgetItemIterator_*>::begin(QList<QTreeWidgetItemIterator_*> *this)

{
  QTreeWidgetItemIterator **n;
  QArrayDataPointer<QTreeWidgetItemIterator_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTreeWidgetItemIterator_*> *)0x934e09);
  QArrayDataPointer<QTreeWidgetItemIterator_*>::operator->(in_RDI);
  n = QArrayDataPointer<QTreeWidgetItemIterator_*>::begin
                ((QArrayDataPointer<QTreeWidgetItemIterator_*> *)0x934e1a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }